

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::AppendModuleDefinitionFlag
          (cmLocalGenerator *this,string *flags,cmGeneratorTarget *target,
          cmLinkLineComputer *linkLineComputer,string *config)

{
  cmMakefile *this_00;
  ModuleDefinitionInfo *pMVar1;
  cmValue cVar2;
  string_view source;
  string flag;
  string local_f0;
  cmAlphaNum local_d0;
  string local_a0;
  char *local_80;
  size_t local_78;
  cmAlphaNum local_60;
  
  pMVar1 = cmGeneratorTarget::GetModuleDefinitionInfo(target,config);
  if ((pMVar1 != (ModuleDefinitionInfo *)0x0) && ((pMVar1->DefFile)._M_string_length != 0)) {
    this_00 = this->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"CMAKE_LINK_DEF_FILE_FLAG",(allocator<char> *)&local_60);
    cVar2 = cmMakefile::GetDefinition(this_00,(string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    if (cVar2.Value != (string *)0x0) {
      local_d0.View_._M_str = ((cVar2.Value)->_M_dataplus)._M_p;
      local_d0.View_._M_len = (cVar2.Value)->_M_string_length;
      (*linkLineComputer->_vptr_cmLinkLineComputer[2])(&local_80,linkLineComputer,pMVar1);
      source._M_str = local_80;
      source._M_len = local_78;
      cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                (&local_f0,&this->super_cmOutputConverter,source,SHELL);
      local_60.View_._M_len = local_f0._M_string_length;
      local_60.View_._M_str = local_f0._M_dataplus._M_p;
      cmStrCat<>(&local_a0,&local_d0,&local_60);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_80);
      (*this->_vptr_cmLocalGenerator[6])(this,flags,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
    }
  }
  return;
}

Assistant:

void cmLocalGenerator::AppendModuleDefinitionFlag(
  std::string& flags, cmGeneratorTarget const* target,
  cmLinkLineComputer* linkLineComputer, std::string const& config)
{
  cmGeneratorTarget::ModuleDefinitionInfo const* mdi =
    target->GetModuleDefinitionInfo(config);
  if (!mdi || mdi->DefFile.empty()) {
    return;
  }

  cmValue defFileFlag =
    this->Makefile->GetDefinition("CMAKE_LINK_DEF_FILE_FLAG");
  if (!defFileFlag) {
    return;
  }

  // Append the flag and value.  Use ConvertToLinkReference to help
  // vs6's "cl -link" pass it to the linker.
  std::string flag =
    cmStrCat(*defFileFlag,
             this->ConvertToOutputFormat(
               linkLineComputer->ConvertToLinkReference(mdi->DefFile),
               cmOutputConverter::SHELL));
  this->AppendFlags(flags, flag);
}